

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

UBool __thiscall icu_63::LocDataParser::checkInc(LocDataParser *this,UChar c)

{
  UChar *pUVar1;
  
  pUVar1 = this->p;
  if ((pUVar1 < this->e) && ((this->ch == c || (*pUVar1 == c)))) {
    this->p = pUVar1 + 1;
    this->ch = L'\xffff';
    return '\x01';
  }
  return '\0';
}

Assistant:

inline UBool checkInc(UChar c) {
        if (p < e && (ch == c || *p == c)) {
            inc();
            return TRUE;
        }
        return FALSE;
    }